

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt.cpp
# Opt level: O2

void R_FillColumnHorizP(void)

{
  uint *puVar1;
  int iVar2;
  BYTE BVar3;
  int iVar4;
  uint uVar5;
  BYTE *pBVar6;
  long lVar7;
  
  iVar4 = dc_count;
  BVar3 = (BYTE)dc_color;
  iVar2 = dc_yl;
  if (0 < dc_count) {
    uVar5 = dc_x & 3;
    puVar1 = dc_ctspan[uVar5];
    *puVar1 = dc_yl;
    puVar1[1] = dc_yh;
    dc_ctspan[uVar5] = puVar1 + 2;
    pBVar6 = dc_temp + (int)(uVar5 + iVar2 * 4);
    if ((iVar4 & 1U) != 0) {
      *pBVar6 = BVar3;
      pBVar6 = pBVar6 + 4;
    }
    if (iVar4 != 1) {
      lVar7 = 0;
      do {
        pBVar6[lVar7 * 8] = BVar3;
        pBVar6[lVar7 * 8 + 4] = BVar3;
        lVar7 = lVar7 + 1;
      } while ((uint)iVar4 >> 1 != (uint)lVar7);
    }
  }
  return;
}

Assistant:

void R_FillColumnHorizP (void)
{
	int count = dc_count;
	BYTE color = dc_color;
	BYTE *dest;

	if (count <= 0)
		return;

	{
		int x = dc_x & 3;
		unsigned int **span = &dc_ctspan[x];

		(*span)[0] = dc_yl;
		(*span)[1] = dc_yh;
		*span += 2;
		dest = &dc_temp[x + 4*dc_yl];
	}

	if (count & 1) {
		*dest = color;
		dest += 4;
	}
	if (!(count >>= 1))
		return;
	do {
		dest[0] = color; dest[4] = color;
		dest += 8;
	} while (--count);
}